

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O1

int nn_ep_init(nn_ep *self,int src,nn_sock *sock,int eid,nn_transport *transport,int bind,char *addr
              )

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  nn_fsm_init(&self->fsm,nn_ep_handler,nn_ep_shutdown,src,self,&sock->fsm);
  self->state = 1;
  self->sock = sock;
  self->eid = eid;
  self->last_errno = 0;
  nn_list_item_init(&self->item);
  (self->options).ipv4only = (sock->ep_template).ipv4only;
  iVar2 = (sock->ep_template).rcvprio;
  (self->options).sndprio = (sock->ep_template).sndprio;
  (self->options).rcvprio = iVar2;
  sVar3 = strlen(addr);
  if (sVar3 < 0x81) {
    strcpy(self->addr,addr);
    iVar1 = (*(&transport->bind)[bind == 0])(self);
    iVar2 = 0;
    if (iVar1 < 0) {
      nn_list_item_term(&self->item);
      nn_fsm_term(&self->fsm);
      iVar2 = iVar1;
    }
    return iVar2;
  }
  nn_ep_init_cold_1();
}

Assistant:

int nn_ep_init (struct nn_ep *self, int src, struct nn_sock *sock, int eid,
    const struct nn_transport *transport, int bind, const char *addr)
{
    int rc;

    nn_fsm_init (&self->fsm, nn_ep_handler, nn_ep_shutdown,
        src, self, &sock->fsm);
    self->state = NN_EP_STATE_IDLE;

    self->sock = sock;
    self->eid = eid;
    self->last_errno = 0;
    nn_list_item_init (&self->item);
    memcpy (&self->options, &sock->ep_template, sizeof(struct nn_ep_options));

    /*  Store the textual form of the address. */
    nn_assert (strlen (addr) <= NN_SOCKADDR_MAX);
    strcpy (self->addr, addr);

    /*  Create transport-specific part of the endpoint. */
    if (bind)
        rc = transport->bind (self);
    else
        rc = transport->connect (self);

    /*  Endpoint creation failed. */
    if (rc < 0) {
        nn_list_item_term (&self->item);
        nn_fsm_term (&self->fsm);
        return rc;
    }

    return 0;
}